

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

int __thiscall
google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(CodedInputStream *this)

{
  byte bVar1;
  int iVar2;
  pair<bool,_const_unsigned_char_*> pVar3;
  pair<bool,_const_unsigned_char_*> p;
  uint64 temp;
  CodedInputStream *this_local;
  uint local_40;
  uint local_3c;
  uint32 part2;
  uint32 part1;
  uint32 part0;
  uint32 b;
  uint8 *ptr;
  byte *local_20;
  byte local_18;
  uint8 *local_10;
  
  iVar2 = BufferSize(this);
  if ((iVar2 < 10) &&
     ((this->buffer_end_ <= this->buffer_ || ((this->buffer_end_[-1] & 0x80) != 0)))) {
    iVar2 = ReadVarintSizeAsIntSlow(this);
    return iVar2;
  }
  local_20 = this->buffer_;
  ptr = (uint8 *)&p.second;
  local_3c = 0;
  local_40 = 0;
  _part0 = local_20 + 1;
  part2 = (uint32)*local_20;
  part1 = part2;
  if ((*local_20 & 0x80) != 0) {
    bVar1 = *_part0;
    part1 = (uint32)bVar1;
    part2 = part1 * 0x80 + (part2 - 0x80);
    _part0 = local_20 + 2;
    if ((bVar1 & 0x80) != 0) {
      bVar1 = local_20[2];
      part1 = (uint32)bVar1;
      part2 = part1 * 0x4000 + (part2 - 0x4000);
      _part0 = local_20 + 3;
      if ((bVar1 & 0x80) != 0) {
        bVar1 = local_20[3];
        part1 = (uint32)bVar1;
        part2 = part1 * 0x200000 + (part2 - 0x200000);
        _part0 = local_20 + 4;
        if ((bVar1 & 0x80) != 0) {
          part2 = part2 + 0xf0000000;
          bVar1 = local_20[4];
          local_3c = (uint)bVar1;
          part1 = local_3c;
          _part0 = local_20 + 5;
          if ((bVar1 & 0x80) != 0) {
            bVar1 = local_20[5];
            part1 = (uint32)bVar1;
            local_3c = part1 * 0x80 + (local_3c - 0x80);
            _part0 = local_20 + 6;
            if ((bVar1 & 0x80) != 0) {
              bVar1 = local_20[6];
              part1 = (uint32)bVar1;
              local_3c = part1 * 0x4000 + (local_3c - 0x4000);
              _part0 = local_20 + 7;
              if ((bVar1 & 0x80) != 0) {
                bVar1 = local_20[7];
                part1 = (uint32)bVar1;
                local_3c = part1 * 0x200000 + (local_3c - 0x200000);
                _part0 = local_20 + 8;
                if ((bVar1 & 0x80) != 0) {
                  local_3c = local_3c + 0xf0000000;
                  bVar1 = local_20[8];
                  local_40 = (uint)bVar1;
                  part1 = local_40;
                  _part0 = local_20 + 9;
                  if ((bVar1 & 0x80) != 0) {
                    _part0 = local_20 + 10;
                    bVar1 = local_20[9];
                    part1 = (uint32)bVar1;
                    local_40 = part1 * 0x80 + (local_40 - 0x80);
                    if ((bVar1 & 0x80) != 0) {
                      this_local._7_1_ = 0;
                      pVar3 = std::make_pair<bool,unsigned_char_const*&>
                                        ((bool *)((long)&this_local + 7),(uchar **)&part0);
                      local_10 = pVar3.second;
                      local_18 = pVar3.first;
                      goto LAB_0042a9c4;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  p.second = (uchar *)((ulong)part2 | (ulong)local_3c << 0x1c | (ulong)local_40 << 0x38);
  this_local._6_1_ = 1;
  pVar3 = std::make_pair<bool,unsigned_char_const*&>
                    ((bool *)((long)&this_local + 6),(uchar **)&part0);
  local_10 = pVar3.second;
  local_18 = pVar3.first;
LAB_0042a9c4:
  if (((local_18 & 1) == 0) || ((uchar *)0x7fffffff < p.second)) {
    this_local._0_4_ = -1;
  }
  else {
    this->buffer_ = local_10;
    this_local._0_4_ = (int)p.second;
  }
  return (int)this_local;
}

Assistant:

int CodedInputStream::ReadVarintSizeAsIntFallback() {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    uint64 temp;
    ::std::pair<bool, const uint8*> p = ReadVarint64FromArray(buffer_, &temp);
    if (!p.first || temp > static_cast<uint64>(INT_MAX)) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    return ReadVarintSizeAsIntSlow();
  }
}